

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DateFormatSymbols::copyData(DateFormatSymbols *this,DateFormatSymbols *other)

{
  UErrorCode *status_00;
  Locale local_1f0;
  Locale local_110;
  undefined1 local_30 [8];
  LocaleBased locBased;
  UErrorCode status;
  DateFormatSymbols *other_local;
  DateFormatSymbols *this_local;
  
  locBased.actual._4_4_ = 0;
  LocaleBased::LocaleBased((LocaleBased *)local_30,this->validLocale,this->actualLocale);
  status_00 = (UErrorCode *)((long)&locBased.actual + 4);
  getLocale(&local_110,other,ULOC_VALID_LOCALE,status_00);
  getLocale(&local_1f0,other,ULOC_ACTUAL_LOCALE,status_00);
  LocaleBased::setLocaleIDs((LocaleBased *)local_30,&local_110,&local_1f0);
  Locale::~Locale(&local_1f0);
  Locale::~Locale(&local_110);
  assignArray(&this->fEras,&this->fErasCount,other->fEras,other->fErasCount);
  assignArray(&this->fEraNames,&this->fEraNamesCount,other->fEraNames,other->fEraNamesCount);
  assignArray(&this->fNarrowEras,&this->fNarrowErasCount,other->fNarrowEras,other->fNarrowErasCount)
  ;
  assignArray(&this->fMonths,&this->fMonthsCount,other->fMonths,other->fMonthsCount);
  assignArray(&this->fShortMonths,&this->fShortMonthsCount,other->fShortMonths,
              other->fShortMonthsCount);
  assignArray(&this->fNarrowMonths,&this->fNarrowMonthsCount,other->fNarrowMonths,
              other->fNarrowMonthsCount);
  assignArray(&this->fStandaloneMonths,&this->fStandaloneMonthsCount,other->fStandaloneMonths,
              other->fStandaloneMonthsCount);
  assignArray(&this->fStandaloneShortMonths,&this->fStandaloneShortMonthsCount,
              other->fStandaloneShortMonths,other->fStandaloneShortMonthsCount);
  assignArray(&this->fStandaloneNarrowMonths,&this->fStandaloneNarrowMonthsCount,
              other->fStandaloneNarrowMonths,other->fStandaloneNarrowMonthsCount);
  assignArray(&this->fWeekdays,&this->fWeekdaysCount,other->fWeekdays,other->fWeekdaysCount);
  assignArray(&this->fShortWeekdays,&this->fShortWeekdaysCount,other->fShortWeekdays,
              other->fShortWeekdaysCount);
  assignArray(&this->fShorterWeekdays,&this->fShorterWeekdaysCount,other->fShorterWeekdays,
              other->fShorterWeekdaysCount);
  assignArray(&this->fNarrowWeekdays,&this->fNarrowWeekdaysCount,other->fNarrowWeekdays,
              other->fNarrowWeekdaysCount);
  assignArray(&this->fStandaloneWeekdays,&this->fStandaloneWeekdaysCount,other->fStandaloneWeekdays,
              other->fStandaloneWeekdaysCount);
  assignArray(&this->fStandaloneShortWeekdays,&this->fStandaloneShortWeekdaysCount,
              other->fStandaloneShortWeekdays,other->fStandaloneShortWeekdaysCount);
  assignArray(&this->fStandaloneShorterWeekdays,&this->fStandaloneShorterWeekdaysCount,
              other->fStandaloneShorterWeekdays,other->fStandaloneShorterWeekdaysCount);
  assignArray(&this->fStandaloneNarrowWeekdays,&this->fStandaloneNarrowWeekdaysCount,
              other->fStandaloneNarrowWeekdays,other->fStandaloneNarrowWeekdaysCount);
  assignArray(&this->fAmPms,&this->fAmPmsCount,other->fAmPms,other->fAmPmsCount);
  assignArray(&this->fNarrowAmPms,&this->fNarrowAmPmsCount,other->fNarrowAmPms,
              other->fNarrowAmPmsCount);
  icu_63::UnicodeString::fastCopyFrom(&this->fTimeSeparator,&other->fTimeSeparator);
  assignArray(&this->fQuarters,&this->fQuartersCount,other->fQuarters,other->fQuartersCount);
  assignArray(&this->fShortQuarters,&this->fShortQuartersCount,other->fShortQuarters,
              other->fShortQuartersCount);
  assignArray(&this->fStandaloneQuarters,&this->fStandaloneQuartersCount,other->fStandaloneQuarters,
              other->fStandaloneQuartersCount);
  assignArray(&this->fStandaloneShortQuarters,&this->fStandaloneShortQuartersCount,
              other->fStandaloneShortQuarters,other->fStandaloneShortQuartersCount);
  assignArray(&this->fWideDayPeriods,&this->fWideDayPeriodsCount,other->fWideDayPeriods,
              other->fWideDayPeriodsCount);
  assignArray(&this->fNarrowDayPeriods,&this->fNarrowDayPeriodsCount,other->fNarrowDayPeriods,
              other->fNarrowDayPeriodsCount);
  assignArray(&this->fAbbreviatedDayPeriods,&this->fAbbreviatedDayPeriodsCount,
              other->fAbbreviatedDayPeriods,other->fAbbreviatedDayPeriodsCount);
  assignArray(&this->fStandaloneWideDayPeriods,&this->fStandaloneWideDayPeriodsCount,
              other->fStandaloneWideDayPeriods,other->fStandaloneWideDayPeriodsCount);
  assignArray(&this->fStandaloneNarrowDayPeriods,&this->fStandaloneNarrowDayPeriodsCount,
              other->fStandaloneNarrowDayPeriods,other->fStandaloneNarrowDayPeriodsCount);
  assignArray(&this->fStandaloneAbbreviatedDayPeriods,&this->fStandaloneAbbreviatedDayPeriodsCount,
              other->fStandaloneAbbreviatedDayPeriods,other->fStandaloneAbbreviatedDayPeriodsCount);
  if (other->fLeapMonthPatterns == (UnicodeString *)0x0) {
    this->fLeapMonthPatterns = (UnicodeString *)0x0;
    this->fLeapMonthPatternsCount = 0;
  }
  else {
    assignArray(&this->fLeapMonthPatterns,&this->fLeapMonthPatternsCount,other->fLeapMonthPatterns,
                other->fLeapMonthPatternsCount);
  }
  if (other->fShortYearNames == (UnicodeString *)0x0) {
    this->fShortYearNames = (UnicodeString *)0x0;
    this->fShortYearNamesCount = 0;
  }
  else {
    assignArray(&this->fShortYearNames,&this->fShortYearNamesCount,other->fShortYearNames,
                other->fShortYearNamesCount);
  }
  if (other->fShortZodiacNames == (UnicodeString *)0x0) {
    this->fShortZodiacNames = (UnicodeString *)0x0;
    this->fShortZodiacNamesCount = 0;
  }
  else {
    assignArray(&this->fShortZodiacNames,&this->fShortZodiacNamesCount,other->fShortZodiacNames,
                other->fShortZodiacNamesCount);
  }
  if (other->fZoneStrings == (UnicodeString **)0x0) {
    this->fZoneStrings = (UnicodeString **)0x0;
    this->fZoneStringsColCount = 0;
    this->fZoneStringsRowCount = 0;
  }
  else {
    this->fZoneStringsColCount = other->fZoneStringsColCount;
    this->fZoneStringsRowCount = other->fZoneStringsRowCount;
    createZoneStrings(this,other->fZoneStrings);
  }
  Locale::operator=(&this->fZSFLocale,&other->fZSFLocale);
  this->fLocaleZoneStrings = (UnicodeString **)0x0;
  icu_63::UnicodeString::fastCopyFrom(&this->fLocalPatternChars,&other->fLocalPatternChars);
  *(undefined8 *)this->fCapitalization = *(undefined8 *)other->fCapitalization;
  *(undefined8 *)(this->fCapitalization + 4) = *(undefined8 *)(other->fCapitalization + 4);
  *(undefined8 *)(this->fCapitalization + 8) = *(undefined8 *)(other->fCapitalization + 8);
  *(undefined4 *)(this->fCapitalization + 0xc) = *(undefined4 *)(other->fCapitalization + 0xc);
  return;
}

Assistant:

void
DateFormatSymbols::copyData(const DateFormatSymbols& other) {
    UErrorCode status = U_ZERO_ERROR;
    U_LOCALE_BASED(locBased, *this);
    locBased.setLocaleIDs(
        other.getLocale(ULOC_VALID_LOCALE, status),
        other.getLocale(ULOC_ACTUAL_LOCALE, status));
    assignArray(fEras, fErasCount, other.fEras, other.fErasCount);
    assignArray(fEraNames, fEraNamesCount, other.fEraNames, other.fEraNamesCount);
    assignArray(fNarrowEras, fNarrowErasCount, other.fNarrowEras, other.fNarrowErasCount);
    assignArray(fMonths, fMonthsCount, other.fMonths, other.fMonthsCount);
    assignArray(fShortMonths, fShortMonthsCount, other.fShortMonths, other.fShortMonthsCount);
    assignArray(fNarrowMonths, fNarrowMonthsCount, other.fNarrowMonths, other.fNarrowMonthsCount);
    assignArray(fStandaloneMonths, fStandaloneMonthsCount, other.fStandaloneMonths, other.fStandaloneMonthsCount);
    assignArray(fStandaloneShortMonths, fStandaloneShortMonthsCount, other.fStandaloneShortMonths, other.fStandaloneShortMonthsCount);
    assignArray(fStandaloneNarrowMonths, fStandaloneNarrowMonthsCount, other.fStandaloneNarrowMonths, other.fStandaloneNarrowMonthsCount);
    assignArray(fWeekdays, fWeekdaysCount, other.fWeekdays, other.fWeekdaysCount);
    assignArray(fShortWeekdays, fShortWeekdaysCount, other.fShortWeekdays, other.fShortWeekdaysCount);
    assignArray(fShorterWeekdays, fShorterWeekdaysCount, other.fShorterWeekdays, other.fShorterWeekdaysCount);
    assignArray(fNarrowWeekdays, fNarrowWeekdaysCount, other.fNarrowWeekdays, other.fNarrowWeekdaysCount);
    assignArray(fStandaloneWeekdays, fStandaloneWeekdaysCount, other.fStandaloneWeekdays, other.fStandaloneWeekdaysCount);
    assignArray(fStandaloneShortWeekdays, fStandaloneShortWeekdaysCount, other.fStandaloneShortWeekdays, other.fStandaloneShortWeekdaysCount);
    assignArray(fStandaloneShorterWeekdays, fStandaloneShorterWeekdaysCount, other.fStandaloneShorterWeekdays, other.fStandaloneShorterWeekdaysCount);
    assignArray(fStandaloneNarrowWeekdays, fStandaloneNarrowWeekdaysCount, other.fStandaloneNarrowWeekdays, other.fStandaloneNarrowWeekdaysCount);
    assignArray(fAmPms, fAmPmsCount, other.fAmPms, other.fAmPmsCount);
    assignArray(fNarrowAmPms, fNarrowAmPmsCount, other.fNarrowAmPms, other.fNarrowAmPmsCount );
    fTimeSeparator.fastCopyFrom(other.fTimeSeparator);  // fastCopyFrom() - see assignArray comments
    assignArray(fQuarters, fQuartersCount, other.fQuarters, other.fQuartersCount);
    assignArray(fShortQuarters, fShortQuartersCount, other.fShortQuarters, other.fShortQuartersCount);
    assignArray(fStandaloneQuarters, fStandaloneQuartersCount, other.fStandaloneQuarters, other.fStandaloneQuartersCount);
    assignArray(fStandaloneShortQuarters, fStandaloneShortQuartersCount, other.fStandaloneShortQuarters, other.fStandaloneShortQuartersCount);
    assignArray(fWideDayPeriods, fWideDayPeriodsCount,
                other.fWideDayPeriods, other.fWideDayPeriodsCount);
    assignArray(fNarrowDayPeriods, fNarrowDayPeriodsCount,
                other.fNarrowDayPeriods, other.fNarrowDayPeriodsCount);
    assignArray(fAbbreviatedDayPeriods, fAbbreviatedDayPeriodsCount,
                other.fAbbreviatedDayPeriods, other.fAbbreviatedDayPeriodsCount);
    assignArray(fStandaloneWideDayPeriods, fStandaloneWideDayPeriodsCount,
                other.fStandaloneWideDayPeriods, other.fStandaloneWideDayPeriodsCount);
    assignArray(fStandaloneNarrowDayPeriods, fStandaloneNarrowDayPeriodsCount,
                other.fStandaloneNarrowDayPeriods, other.fStandaloneNarrowDayPeriodsCount);
    assignArray(fStandaloneAbbreviatedDayPeriods, fStandaloneAbbreviatedDayPeriodsCount,
                other.fStandaloneAbbreviatedDayPeriods, other.fStandaloneAbbreviatedDayPeriodsCount);
    if (other.fLeapMonthPatterns != NULL) {
        assignArray(fLeapMonthPatterns, fLeapMonthPatternsCount, other.fLeapMonthPatterns, other.fLeapMonthPatternsCount);
    } else {
        fLeapMonthPatterns = NULL;
        fLeapMonthPatternsCount = 0;
    }
    if (other.fShortYearNames != NULL) {
        assignArray(fShortYearNames, fShortYearNamesCount, other.fShortYearNames, other.fShortYearNamesCount);
    } else {
        fShortYearNames = NULL;
        fShortYearNamesCount = 0;
    }
    if (other.fShortZodiacNames != NULL) {
        assignArray(fShortZodiacNames, fShortZodiacNamesCount, other.fShortZodiacNames, other.fShortZodiacNamesCount);
    } else {
        fShortZodiacNames = NULL;
        fShortZodiacNamesCount = 0;
    }

    if (other.fZoneStrings != NULL) {
        fZoneStringsColCount = other.fZoneStringsColCount;
        fZoneStringsRowCount = other.fZoneStringsRowCount;
        createZoneStrings((const UnicodeString**)other.fZoneStrings);

    } else {
        fZoneStrings = NULL;
        fZoneStringsColCount = 0;
        fZoneStringsRowCount = 0;
    }
    fZSFLocale = other.fZSFLocale;
    // Other zone strings data is created on demand
    fLocaleZoneStrings = NULL;

    // fastCopyFrom() - see assignArray comments
    fLocalPatternChars.fastCopyFrom(other.fLocalPatternChars);

    uprv_memcpy(fCapitalization, other.fCapitalization, sizeof(fCapitalization));
}